

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O0

int chacha_check_validity(void)

{
  uint uVar1;
  uint uVar2;
  int res;
  uint8_t zero_buffer [2049];
  undefined1 local_808 [2056];
  
  memset(local_808,0,0x801);
  uVar1 = chacha_test((uint8_t *)zero_buffer._160_8_);
  uVar2 = chacha_test((uint8_t *)zero_buffer._160_8_);
  return uVar2 & uVar1 & 1;
}

Assistant:

int
chacha_check_validity() {
    /* unaligned generation is tested, so buffer must have max+1 bytes */
    uint8_t zero_buffer[CHACHA_TEST_LEN+1] = {0};
    int res = 1;
    res &= chacha_test(zero_buffer); /* xors stream of random bytes with zero_buffer */
    res &= chacha_test(NULL); /* writes stream of random bytes directly */
    return res;
}